

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatEdge.c
# Opt level: O1

void Seg_ManCreateCnf(Seg_Man_t *p,int fTwo,int fVerbose)

{
  Gia_Obj_t *pGVar1;
  undefined8 uVar2;
  int *piVar3;
  void *__ptr;
  Seg_Man_t *pSVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  ulong uVar13;
  Vec_Int_t *pVVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  Tim_Man_t *pTVar18;
  Vec_Ptr_t *pVVar19;
  long lVar20;
  int pLits [3];
  timespec ts;
  int local_bc;
  int local_b8;
  int local_b4;
  ulong local_b0;
  int local_a4;
  Seg_Man_t *local_a0;
  ulong local_98;
  Tim_Man_t *local_90;
  Vec_Ptr_t *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  int local_58;
  int local_54;
  long local_50;
  int local_48;
  int local_44;
  timespec local_40;
  
  pTVar18 = (Tim_Man_t *)p->pGia->pManTime;
  local_58 = fVerbose;
  local_54 = fTwo;
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    local_50 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_50 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  local_48 = sat_solver_nclauses(p->pSat);
  pGVar11 = p->pGia;
  local_a0 = p;
  if (pGVar11->nObjs < 1) {
    uVar13 = 0;
  }
  else {
    pVVar19 = (Vec_Ptr_t *)0x0;
    uVar13 = 0;
    local_90 = pTVar18;
    do {
      if (pGVar11->pObjs == (Gia_Obj_t *)0x0) break;
      if (((long)p->vFirsts->nSize <= (long)pVVar19) || ((long)p->vNvars->nSize <= (long)pVVar19))
      goto LAB_007ae65b;
      uVar6 = p->vFirsts->pArray[(long)pVVar19];
      local_b0 = (ulong)uVar6;
      local_80 = CONCAT44(local_80._4_4_,p->vNvars->pArray[(long)pVVar19]);
      local_88 = pVVar19;
      if (pTVar18 == (Tim_Man_t *)0x0) {
LAB_007add3f:
        if ((long)pGVar11->vMapping->nSize <= (long)pVVar19) {
LAB_007ae65b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (pGVar11->vMapping->pArray[(long)pVVar19] != 0) {
          pGVar11 = p->pGia;
          pVVar14 = pGVar11->vMapping;
          lVar15 = (long)pVVar14->nSize;
          if (lVar15 <= (long)pVVar19) goto LAB_007ae65b;
          local_a4 = uVar6 * 2;
          local_44 = uVar6 * 2 + 2;
          uVar17 = 0;
          while( true ) {
            piVar3 = pVVar14->pArray;
            lVar16 = (long)piVar3[(long)pVVar19];
            if ((lVar16 < 0) || ((int)lVar15 <= piVar3[(long)pVVar19])) goto LAB_007ae65b;
            if ((long)piVar3[lVar16] <= (long)uVar17) break;
            uVar6 = piVar3[lVar16 + uVar17 + 1];
            if (pTVar18 == (Tim_Man_t *)0x0) {
LAB_007adeb4:
              if (((int)uVar6 < 0) || (pGVar11->nObjs <= (int)uVar6)) goto LAB_007ae67a;
              if ((~*(uint *)(pGVar11->pObjs + uVar6) & 0x1fffffff) != 0 &&
                  -1 < (int)*(uint *)(pGVar11->pObjs + uVar6)) {
                if ((p->vFirsts->nSize <= (int)uVar6) || (p->vNvars->nSize <= (int)uVar6))
                goto LAB_007ae65b;
                iVar5 = p->vNvars->pArray[uVar6];
                if ((iVar5 == 1) || ((int)local_80 <= iVar5)) {
                  local_98 = uVar17;
                  __assert_fail("nVars != 1 && nVars < nVarsLut",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x138,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                local_70 = (ulong)(uint)p->vFirsts->pArray[uVar6];
                iVar7 = (int)uVar13;
                local_98 = uVar17;
                if (iVar5 == 0) {
                  if (iVar7 < 0) goto LAB_007ae5a1;
                  local_bc = iVar7 * 2 + 1;
                  if ((int)local_b0 < 0) goto LAB_007ae5a1;
                  local_b8 = local_a4;
                  iVar9 = sat_solver_addclause(p->pSat,&local_bc,&local_b4);
                  if (iVar9 == 0) {
                    __assert_fail("value",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                  ,0x13f,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                  }
                  local_bc = iVar7 * 2;
                  local_b8 = local_44;
                  iVar9 = sat_solver_addclause(p->pSat,&local_bc,&local_b4);
                  if (iVar9 == 0) {
                    __assert_fail("value",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                  ,0x144,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                  }
                }
                if (0 < iVar5) {
                  local_78 = CONCAT44(local_78._4_4_,iVar7 * 2);
                  local_68 = CONCAT44(local_68._4_4_,iVar7 * 2 + 1);
                  iVar7 = (int)local_70 * 2 + 1;
                  uVar17 = local_b0 & 0xffffffff;
                  iVar9 = local_a4;
                  local_60 = uVar13;
                  do {
                    pSVar4 = local_a0;
                    if (((int)local_70 < 0) || (local_bc = iVar7, (int)local_60 < 0))
                    goto LAB_007ae5a1;
                    local_b8 = (int)local_68;
                    if ((int)uVar17 < 0) goto LAB_007ae5a1;
                    local_b4 = iVar9;
                    iVar8 = sat_solver_addclause(local_a0->pSat,&local_bc,(lit *)&local_b0);
                    if (iVar8 == 0) {
                      __assert_fail("value",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                    ,0x14d,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                    }
                    local_b8 = (uint)local_78;
                    iVar9 = iVar9 + 2;
                    local_bc = iVar7;
                    local_b4 = iVar9;
                    iVar8 = sat_solver_addclause(pSVar4->pSat,&local_bc,(lit *)&local_b0);
                    if (iVar8 == 0) {
                      __assert_fail("value",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                    ,0x153,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                    }
                    uVar17 = (ulong)((int)uVar17 + 1);
                    iVar7 = iVar7 + 2;
                    iVar5 = iVar5 + -1;
                    uVar13 = local_60;
                  } while (iVar5 != 0);
                }
                uVar13 = (ulong)((int)uVar13 + 1);
                p = local_a0;
                uVar17 = local_98;
                pTVar18 = local_90;
                pVVar19 = local_88;
              }
            }
            else {
              if (((int)uVar6 < 0) || (pGVar11->nObjs <= (int)uVar6)) goto LAB_007ae67a;
              if (((undefined1  [12])pGVar11->pObjs[uVar6] & (undefined1  [12])0x9fffffff) !=
                  (undefined1  [12])0x9fffffff) goto LAB_007adeb4;
              if ((p->vFirsts->nSize <= (int)uVar6) || (p->vNvars->nSize <= (int)uVar6))
              goto LAB_007ae65b;
              iVar5 = p->vNvars->pArray[uVar6];
              if ((int)local_80 < iVar5) {
                __assert_fail("nVars <= nVarsLut",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                              ,0x128,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
              }
              pTVar18 = local_90;
              if (0 < iVar5) {
                iVar9 = p->vFirsts->pArray[uVar6];
                iVar7 = iVar9 * 2 + 1;
                uVar12 = local_b0 & 0xffffffff;
                iVar8 = local_a4;
                local_98 = uVar17;
                do {
                  if ((iVar9 < 0) || (local_bc = iVar7, (int)uVar12 < 0)) goto LAB_007ae5a1;
                  local_b8 = iVar8;
                  iVar10 = sat_solver_addclause(local_a0->pSat,&local_bc,&local_b4);
                  if (iVar10 == 0) {
                    __assert_fail("value",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                  ,0x130,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                  }
                  iVar8 = iVar8 + 2;
                  uVar12 = (ulong)((int)uVar12 + 1);
                  iVar7 = iVar7 + 2;
                  iVar5 = iVar5 + -1;
                  p = local_a0;
                  uVar17 = local_98;
                  pTVar18 = local_90;
                  pVVar19 = local_88;
                } while (iVar5 != 0);
              }
            }
            uVar17 = uVar17 + 1;
            pGVar11 = p->pGia;
            pVVar14 = pGVar11->vMapping;
            lVar15 = (long)pVVar14->nSize;
            if (lVar15 <= (long)pVVar19) goto LAB_007ae65b;
          }
        }
      }
      else {
        pGVar1 = pGVar11->pObjs + (long)pVVar19;
        uVar2 = *(undefined8 *)pGVar1;
        if (((uint)uVar2 & 0x9fffffff) != 0x9fffffff) goto LAB_007add3f;
        iVar5 = Tim_ManBoxForCi(pTVar18,(uint)((ulong)uVar2 >> 0x20) & 0x1fffffff);
        if ((0 < (int)local_80) && (-1 < iVar5)) {
          uVar6 = Tim_ManBoxOutputFirst(pTVar18,iVar5);
          uVar2 = *(undefined8 *)pGVar1;
          if (-1 < (int)uVar2) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          if (uVar6 == ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff)) {
            iVar7 = Tim_ManBoxInputNum(pTVar18,iVar5);
            uVar6 = Tim_ManBoxInputFirst(pTVar18,iVar5);
            if (1 < iVar7) {
              local_68 = (ulong)(iVar7 - 1);
              local_70 = (ulong)uVar6;
              local_98 = CONCAT44(local_98._4_4_,(int)local_b0 * 2 + 2);
              uVar17 = 0;
              local_78 = CONCAT44(local_78._4_4_,uVar6);
              local_60 = uVar13;
              do {
                if ((int)uVar6 < 0) goto LAB_007ae65b;
                pGVar11 = p->pGia;
                if (pGVar11->vCos->nSize <= (int)(local_70 + uVar17)) goto LAB_007ae65b;
                iVar5 = pGVar11->vCos->pArray[local_70 + uVar17];
                if (((long)iVar5 < 0) || (pGVar11->nObjs <= iVar5)) goto LAB_007ae67a;
                uVar6 = iVar5 - (*(uint *)(pGVar11->pObjs + iVar5) & 0x1fffffff);
                if ((((int)uVar6 < 0) || (p->vFirsts->nSize <= (int)uVar6)) ||
                   (p->vNvars->nSize <= (int)uVar6)) goto LAB_007ae65b;
                iVar5 = p->vNvars->pArray[uVar6];
                if ((int)local_80 <= iVar5) {
                  __assert_fail("nVars < nVarsLut",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x101,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                if (0 < iVar5) {
                  iVar9 = p->vFirsts->pArray[uVar6];
                  iVar7 = iVar9 * 2 + 1;
                  uVar13 = local_b0 & 0xffffffff;
                  uVar12 = local_98 & 0xffffffff;
                  do {
                    if ((iVar9 < 0) || (local_bc = iVar7, (int)uVar13 < -1)) goto LAB_007ae5a1;
                    local_b8 = (int)uVar12;
                    iVar8 = sat_solver_addclause(local_a0->pSat,&local_bc,&local_b4);
                    if (iVar8 == 0) {
                      __assert_fail("value",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                    ,0x108,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                    }
                    uVar12 = (ulong)((int)uVar12 + 2);
                    uVar13 = (ulong)((int)uVar13 + 1);
                    iVar7 = iVar7 + 2;
                    iVar5 = iVar5 + -1;
                  } while (iVar5 != 0);
                }
                uVar17 = uVar17 + 1;
                p = local_a0;
                uVar13 = local_60;
                pTVar18 = local_90;
                pVVar19 = local_88;
                uVar6 = (uint)local_78;
              } while (uVar17 != local_68);
            }
          }
          else {
            if ((int)uVar6 < 0) goto LAB_007ae65b;
            pVVar14 = p->pGia->vCis;
            if (pVVar14->nSize <= (int)uVar6) goto LAB_007ae65b;
            iVar5 = pVVar14->pArray[uVar6];
            lVar15 = (long)iVar5;
            if ((lVar15 < 0) || (p->pGia->nObjs <= iVar5)) {
LAB_007ae67a:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            if ((p->vFirsts->nSize <= iVar5) || (p->vNvars->nSize <= iVar5)) goto LAB_007ae65b;
            iVar5 = p->vNvars->pArray[lVar15];
            pVVar19 = local_88;
            if (0 < iVar5) {
              iVar9 = p->vFirsts->pArray[lVar15];
              iVar8 = (int)local_b0 * 2;
              iVar7 = iVar9 * 2 + 1;
              do {
                if ((iVar9 < 0) || (local_bc = iVar7, (int)local_b0 < 0)) goto LAB_007ae5a1;
                local_b8 = iVar8;
                iVar10 = sat_solver_addclause(local_a0->pSat,&local_bc,&local_b4);
                if (iVar10 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x11a,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                iVar8 = iVar8 + 2;
                local_b0 = (ulong)((int)local_b0 + 1);
                iVar7 = iVar7 + 2;
                iVar5 = iVar5 + -1;
                p = local_a0;
                pVVar19 = local_88;
              } while (iVar5 != 0);
            }
          }
        }
      }
      pVVar19 = (Vec_Ptr_t *)((long)&pVVar19->nCap + 1);
      pGVar11 = p->pGia;
    } while ((long)pVVar19 < (long)pGVar11->nObjs);
  }
  if ((int)uVar13 != p->nVars) {
    __assert_fail("Count == p->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                  ,0x158,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
  }
  if (local_58 != 0) {
    iVar5 = sat_solver_nclauses(p->pSat);
    printf("Delay constraints = %d. ",(ulong)(uint)(iVar5 - local_48));
  }
  local_a4 = sat_solver_nclauses(p->pSat);
  local_90 = (Tim_Man_t *)Seg_ManCollectObjEdges(p->vEdges,p->pGia->nObjs);
  local_80 = (ulong)*(int *)((long)&local_90->vBoxes + 4);
  if (0 < (long)local_80) {
    local_88 = local_90->vDelayTables;
    uVar13 = 0;
    do {
      pVVar19 = local_88;
      iVar5 = local_88[uVar13].nSize;
      local_b0 = uVar13;
      if (local_54 == 0) {
        if (1 < iVar5) goto LAB_007ae37e;
      }
      else if (iVar5 < 0xb) {
        if (((local_54 != 0) && (2 < iVar5)) && (0 < local_88[uVar13].nSize)) {
          local_78 = 2;
          local_98 = 1;
          local_68 = 0;
          do {
            uVar17 = local_68 + 1;
            if ((long)uVar17 < (long)pVVar19[uVar13].nSize) {
              uVar6 = *(uint *)((long)pVVar19[uVar13].pArray + local_68 * 4);
              local_60 = (ulong)uVar6;
              iVar5 = uVar6 * 2 + 1;
              uVar12 = local_98;
              lVar15 = local_78;
              local_68 = uVar17;
              do {
                local_70 = uVar12 + 1;
                if ((int)local_70 < pVVar19[uVar13].nSize) {
                  if ((int)local_60 < 0) goto LAB_007ae5a1;
                  iVar9 = *(int *)((long)pVVar19[uVar13].pArray + uVar12 * 4);
                  iVar7 = iVar9 * 2 + 1;
                  lVar16 = lVar15;
                  do {
                    iVar8 = *(int *)((long)pVVar19[uVar13].pArray + lVar16 * 4);
                    local_bc = iVar5;
                    if ((iVar9 < 0) || (local_b8 = iVar7, iVar8 < 0)) goto LAB_007ae5a1;
                    local_b4 = iVar8 * 2 + 1;
                    iVar8 = sat_solver_addclause(local_a0->pSat,&local_bc,(lit *)&local_b0);
                    if (iVar8 == 0) {
                      __assert_fail("value",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                    ,0x185,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                    }
                    lVar16 = lVar16 + 1;
                  } while ((int)lVar16 < pVVar19[uVar13].nSize);
                }
                lVar15 = lVar15 + 1;
                uVar12 = local_70;
                uVar17 = local_68;
              } while ((int)local_70 < pVVar19[uVar13].nSize);
            }
            local_68 = uVar17;
            local_78 = local_78 + 1;
            local_98 = local_98 + 1;
            p = local_a0;
          } while ((long)local_68 < (long)pVVar19[uVar13].nSize);
        }
      }
      else {
LAB_007ae37e:
        if (0 < local_88[uVar13].nSize) {
          lVar16 = 1;
          lVar15 = 0;
          do {
            lVar20 = lVar15 + 1;
            if (lVar20 < pVVar19[uVar13].nSize) {
              iVar5 = *(int *)((long)pVVar19[uVar13].pArray + lVar15 * 4);
              if (iVar5 < 0) goto LAB_007ae5a1;
              iVar5 = iVar5 * 2 + 1;
              lVar15 = lVar16;
              do {
                iVar7 = *(int *)((long)pVVar19[uVar13].pArray + lVar15 * 4);
                local_bc = iVar5;
                if (iVar7 < 0) goto LAB_007ae5a1;
                local_b8 = iVar7 * 2 + 1;
                iVar7 = sat_solver_addclause(p->pSat,&local_bc,&local_b4);
                if (iVar7 == 0) {
                  __assert_fail("value",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                                ,0x178,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
                }
                lVar15 = lVar15 + 1;
              } while ((int)lVar15 < pVVar19[uVar13].nSize);
            }
            lVar16 = lVar16 + 1;
            lVar15 = lVar20;
          } while (lVar20 < pVVar19[uVar13].nSize);
        }
      }
      uVar13 = local_b0 + 1;
    } while (uVar13 != local_80);
  }
  pTVar18 = local_90;
  iVar5 = *(int *)&local_90->vBoxes;
  if (0 < (long)iVar5) {
    pVVar19 = local_90->vDelayTables;
    lVar15 = 0;
    do {
      __ptr = *(void **)((long)&pVVar19->pArray + lVar15);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar19->pArray + lVar15) = 0;
      }
      lVar15 = lVar15 + 0x10;
    } while ((long)iVar5 * 0x10 != lVar15);
  }
  if (pTVar18->vDelayTables != (Vec_Ptr_t *)0x0) {
    free(pTVar18->vDelayTables);
    pTVar18->vDelayTables = (Vec_Ptr_t *)0x0;
  }
  pTVar18->vBoxes = (Vec_Ptr_t *)0x0;
  free(pTVar18);
  pVVar14 = p->vToSkip;
  if (0 < pVVar14->nSize) {
    lVar15 = 0;
    do {
      if (pVVar14->pArray[lVar15] < 0) {
LAB_007ae5a1:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      local_bc = pVVar14->pArray[lVar15] * 2 + 1;
      iVar5 = sat_solver_addclause(p->pSat,&local_bc,&local_b8);
      if (iVar5 == 0) {
        __assert_fail("value",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatEdge.c"
                      ,399,"void Seg_ManCreateCnf(Seg_Man_t *, int, int)");
      }
      lVar15 = lVar15 + 1;
      pVVar14 = p->vToSkip;
    } while (lVar15 < pVVar14->nSize);
  }
  if (local_58 != 0) {
    iVar5 = sat_solver_nclauses(p->pSat);
    printf("Edge constraints = %d. ",(ulong)(uint)(iVar5 - local_a4));
    iVar7 = 3;
    iVar5 = clock_gettime(3,&local_40);
    if (iVar5 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    lVar15 = lVar15 + local_50;
    Abc_Print(iVar7,"%s =","Time");
    Abc_Print(iVar7,"%9.2f sec\n",(double)lVar15 / 1000000.0);
  }
  return;
}

Assistant:

void Seg_ManCreateCnf( Seg_Man_t * p, int fTwo, int fVerbose )
{
    Tim_Man_t * pTim = (Tim_Man_t *)p->pGia->pManTime;
    Gia_Obj_t * pObj;
    Vec_Wec_t * vObjEdges;
    Vec_Int_t * vLevel;
    int iLut, iFanin, iFirst;
    int pLits[3], Count = 0;
    int i, k, nVars, Edge, value;
    abctime clk = Abc_Clock();
    // edge delay constraints
    int nConstr = sat_solver_nclauses(p->pSat);
    Gia_ManForEachObj( p->pGia, pObj, iLut )
    {
        int iFirstLut = Vec_IntEntry( p->vFirsts, iLut );
        int nVarsLut  = Vec_IntEntry( p->vNvars, iLut );
        if ( pTim && Gia_ObjIsCi(pObj) )
        {
            int iBox = Tim_ManBoxForCi( pTim, Gia_ObjCioId(pObj) );
            if ( nVarsLut > 0 && iBox >= 0 )
            {
                int iCiId = Tim_ManBoxOutputFirst( pTim, iBox );
                if ( iCiId == Gia_ObjCioId(pObj) ) // first input
                {
                    int nIns = Tim_ManBoxInputNum( pTim, iBox );
                    int iIn0 = Tim_ManBoxInputFirst( pTim, iBox );
                    for ( i = 0; i < nIns-1; i++ ) // skip carry-in pin
                    {
                        Gia_Obj_t * pOut = Gia_ManCo( p->pGia, iIn0+i );
                        int iDriverId = Gia_ObjFaninId0p( p->pGia, pOut );
                        int AddOn;

                        iFirst = Vec_IntEntry( p->vFirsts, iDriverId );
                        nVars  = Vec_IntEntry( p->vNvars, iDriverId );
                        assert( nVars < nVarsLut );
                        AddOn = (int)(nVars < nVarsLut);
                        for ( k = 0; k < nVars; k++ )
                        {
                            pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                            pLits[1] = Abc_Var2Lit( iFirstLut+k+AddOn, 0 );
                            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                            assert( value );
                        }
                    }
                }
                else // intermediate input
                {
                    Gia_Obj_t * pIn = Gia_ManCi( p->pGia, iCiId );
                    int iObjId = Gia_ObjId( p->pGia, pIn );

                    iFirst = Vec_IntEntry( p->vFirsts, iObjId );
                    nVars  = Vec_IntEntry( p->vNvars, iObjId );
                    if ( nVars > 0 )
                    {
                        for ( k = 0; k < nVars; k++ )
                        {
                            pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                            pLits[1] = Abc_Var2Lit( iFirstLut+k, 0 );
                            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                            assert( value );
                        }
                    }
                }
            }
            continue;
        }
        if ( !Gia_ObjIsLut(p->pGia, iLut) )
            continue;
        Gia_LutForEachFanin( p->pGia, iLut, iFanin, i )
            if ( pTim && Gia_ObjIsCi(Gia_ManObj(p->pGia, iFanin)) )
            {
                iFirst = Vec_IntEntry( p->vFirsts, iFanin );
                nVars  = Vec_IntEntry( p->vNvars, iFanin );
                assert( nVars <= nVarsLut );
                if ( nVars > 0 )
                {
                    for ( k = 0; k < nVars; k++ )
                    {
                        pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                        pLits[1] = Abc_Var2Lit( iFirstLut+k, 0 );
                        value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                        assert( value );
                    }
                }
            }
            else if ( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iFanin)) )
            {
                iFirst = Vec_IntEntry( p->vFirsts, iFanin );
                nVars  = Vec_IntEntry( p->vNvars, iFanin );
                assert( nVars != 1 && nVars < nVarsLut );
                // add initial
                if ( nVars == 0 )
                {
                    pLits[0] = Abc_Var2Lit( Count, 1 );
                    pLits[1] = Abc_Var2Lit( iFirstLut, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                    assert( value );

                    pLits[0] = Abc_Var2Lit( Count, 0 );
                    pLits[1] = Abc_Var2Lit( iFirstLut+1, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                    assert( value );
                }
                // add others
                for ( k = 0; k < nVars; k++ )
                {
                    pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                    pLits[1] = Abc_Var2Lit( Count, 1 );
                    pLits[2] = Abc_Var2Lit( iFirstLut+k, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                    assert( value );

                    pLits[0] = Abc_Var2Lit( iFirst+k, 1 );
                    pLits[1] = Abc_Var2Lit( Count, 0 );
                    pLits[2] = Abc_Var2Lit( iFirstLut+k+1, 0 );
                    value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                    assert( value );
                }
                Count++;
            }
    }
    assert( Count == p->nVars );
    if ( fVerbose )
    printf( "Delay constraints = %d. ", sat_solver_nclauses(p->pSat) - nConstr );
    nConstr = sat_solver_nclauses(p->pSat);
/*
    // delay relationship constraints
    Vec_IntForEachEntryTwo( p->vFirsts, p->vNvars, iFirst, nVars, iLut )
    {
        if ( nVars < 2 )
            continue;
        for ( i = 1; i < nVars; i++ )
        {
            pLits[0] = Abc_Var2Lit( iFirst + i - 1, 1 );
            pLits[1] = Abc_Var2Lit( iFirst + i,     0 );
            value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
            assert( value );
        }
    }
*/
    // edge compatibility constraint
    vObjEdges = Seg_ManCollectObjEdges( p->vEdges, Gia_ManObjNum(p->pGia) );
    Vec_WecForEachLevel( vObjEdges, vLevel, i )
    {
        int v1, v2, v3, Var1, Var2, Var3;
        if ( (!fTwo && Vec_IntSize(vLevel) >= 2) || (fTwo && Vec_IntSize(vLevel) > 10) )
        {
            Vec_IntForEachEntry( vLevel, Var1, v1 )
            Vec_IntForEachEntryStart( vLevel, Var2, v2, v1 + 1 )
            {
                pLits[0] = Abc_Var2Lit( Var1, 1 );
                pLits[1] = Abc_Var2Lit( Var2, 1 );
                value = sat_solver_addclause( p->pSat, pLits, pLits+2 );
                assert( value );
            }
        }
        else if ( fTwo && Vec_IntSize(vLevel) >= 3 )
        {
            Vec_IntForEachEntry( vLevel, Var1, v1 )
            Vec_IntForEachEntryStart( vLevel, Var2, v2, v1 + 1 )
            Vec_IntForEachEntryStart( vLevel, Var3, v3, v2 + 1 )
            {
                pLits[0] = Abc_Var2Lit( Var1, 1 );
                pLits[1] = Abc_Var2Lit( Var2, 1 );
                pLits[2] = Abc_Var2Lit( Var3, 1 );
                value = sat_solver_addclause( p->pSat, pLits, pLits+3 );
                assert( value );
            }
        }
    }
    Vec_WecFree( vObjEdges );
    // block forbidden edges
    Vec_IntForEachEntry( p->vToSkip, Edge, i )
    {
        pLits[0] = Abc_Var2Lit( Edge, 1 );
        value = sat_solver_addclause( p->pSat, pLits, pLits+1 );
        assert( value );
    }
    if ( fVerbose )
    printf( "Edge constraints = %d. ", sat_solver_nclauses(p->pSat) - nConstr );
    if ( fVerbose )
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}